

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

void __thiscall ExecutorX86::UpdateFunctionPointer(ExecutorX86 *this,uint source,uint target)

{
  FastVector<unsigned_char_*,_false,_false> *this_00;
  uchar *puVar1;
  uchar **ppuVar2;
  ExpiredFunctionAddressList *pEVar3;
  uint i;
  uint index;
  
  this_00 = &this->functionAddress;
  ppuVar2 = FastVector<unsigned_char_*,_false,_false>::operator[](this_00,target);
  puVar1 = *ppuVar2;
  ppuVar2 = FastVector<unsigned_char_*,_false,_false>::operator[](this_00,source);
  *ppuVar2 = puVar1;
  for (index = 0; index < (this->expiredFunctionAddressLists).count; index = index + 1) {
    pEVar3 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::operator[]
                       (&this->expiredFunctionAddressLists,index);
    if (source < pEVar3->count) {
      ppuVar2 = FastVector<unsigned_char_*,_false,_false>::operator[](this_00,target);
      pEVar3->data[source] = *ppuVar2;
    }
  }
  return;
}

Assistant:

void ExecutorX86::UpdateFunctionPointer(unsigned source, unsigned target)
{
	functionAddress[source] = functionAddress[target];

	for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
	{
		ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

		if(source < info.count)
			info.data[source] = functionAddress[target];
	}
}